

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

int __thiscall Fl_Type::user_defined(Fl_Type *this,char *cbname)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  size_t sVar3;
  Fl_Type *local_28;
  Fl_Type *p;
  char *cbname_local;
  Fl_Type *this_local;
  
  local_28 = first;
  do {
    if (local_28 == (Fl_Type *)0x0) {
      return 0;
    }
    iVar1 = (*local_28->_vptr_Fl_Type[5])();
    iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"Function");
    if ((iVar1 == 0) && (pcVar2 = name(local_28), pcVar2 != (char *)0x0)) {
      pcVar2 = name(local_28);
      sVar3 = strlen(cbname);
      iVar1 = strncmp(pcVar2,cbname,sVar3);
      if (iVar1 == 0) {
        pcVar2 = name(local_28);
        sVar3 = strlen(cbname);
        if (pcVar2[sVar3] == '(') {
          return 1;
        }
      }
    }
    local_28 = local_28->next;
  } while( true );
}

Assistant:

int Fl_Type::user_defined(const char* cbname) const {
  for (Fl_Type* p = Fl_Type::first; p ; p = p->next)
    if (strcmp(p->type_name(), "Function") == 0 && p->name() != 0)
      if (strncmp(p->name(), cbname, strlen(cbname)) == 0)
        if (p->name()[strlen(cbname)] == '(')
          return 1;
  return 0;
}